

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacNtk.c
# Opt level: O3

void Bac_ManAssignInternWordNamesNtk(Bac_Ntk_t *p,Vec_Int_t *vMap)

{
  byte *pbVar1;
  byte bVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  int *piVar6;
  long lVar7;
  int iVar8;
  char *pcVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  int iVar14;
  char *__file;
  char *__assertion;
  ulong uVar15;
  int i;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  uint uVar19;
  
  if ((p->vName).pArray == (int *)0x0) {
    iVar8 = (p->vType).nCap;
    lVar12 = (long)iVar8;
    if (lVar12 == 0) {
      __assert_fail("Bac_NtkObjNumAlloc(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/bac/bac.h"
                    ,0xfc,"void Bac_NtkStartNames(Bac_Ntk_t *)");
    }
    if ((p->vName).nCap < iVar8) {
      piVar6 = (int *)malloc(lVar12 * 4);
      (p->vName).pArray = piVar6;
      if (piVar6 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (p->vName).nCap = iVar8;
    }
    else {
      piVar6 = (int *)0x0;
    }
    if (0 < iVar8) {
      memset(piVar6,0,lVar12 << 2);
    }
    (p->vName).nSize = iVar8;
  }
  uVar4 = Bac_ManAssignCountNames(p);
  if (1 < uVar4) {
    uVar5 = uVar4 - 1;
    uVar4 = 0;
    do {
      uVar4 = uVar4 + 1;
      bVar3 = 9 < uVar5;
      uVar5 = uVar5 / 10;
    } while (bVar3);
  }
  uVar5 = (p->vType).nSize;
  uVar17 = (ulong)uVar5;
  if (0 < (int)uVar5) {
    lVar12 = 0;
    do {
      uVar5 = (uint)(byte)(p->vType).pArray[lVar12];
      if ((uVar5 < 10) && ((0x30cU >> (uVar5 & 0x1f) & 1) != 0)) {
        if ((p->vName).nSize <= lVar12) goto LAB_0030f14f;
        if ((p->vName).pArray[lVar12] != 0) {
          uVar5 = Bac_ObjName(p,(int)lVar12);
          if ((int)uVar5 < 0) goto LAB_0030f130;
          if (vMap->nSize <= (int)(uVar5 >> 2)) goto LAB_0030f111;
          vMap->pArray[uVar5 >> 2] = 1;
          uVar17 = (ulong)(uint)(p->vType).nSize;
        }
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < (int)uVar17);
    if (0 < (int)uVar17) {
      lVar12 = 0;
      do {
        bVar2 = (p->vType).pArray[lVar12];
        if (0xffffffbb < (bVar2 >> 1) - 0x49) {
          if ((bVar2 & 0xfc) == 4) goto LAB_0030f18d;
          if ((p->vName).nSize <= lVar12) goto LAB_0030f14f;
          if ((p->vName).pArray[lVar12] != 0) {
            uVar5 = Bac_ObjName(p,(int)lVar12);
            if ((int)uVar5 < 0) goto LAB_0030f130;
            if (vMap->nSize <= (int)(uVar5 >> 2)) goto LAB_0030f111;
            vMap->pArray[uVar5 >> 2] = 1;
            uVar17 = (ulong)(uint)(p->vType).nSize;
          }
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 < (int)uVar17);
      if (0 < (int)uVar17) {
        iVar14 = -1;
        iVar8 = 1;
        uVar16 = 0;
LAB_0030e9cc:
        iVar10 = (int)uVar17;
        pcVar9 = (p->vType).pArray;
        bVar2 = pcVar9[uVar16];
        if ((9 < bVar2) || ((0x30cU >> (bVar2 & 0x1f) & 1) == 0)) goto LAB_0030ebe8;
        if ((long)(p->vName).nSize <= (long)uVar16) goto LAB_0030f14f;
        if ((p->vName).pArray[uVar16] != 0) {
          iVar14 = -1;
          goto LAB_0030ebe8;
        }
        i = (int)uVar16;
        if ((bVar2 & 1) == 0) {
          if ((bVar2 & 0xfe) != 2) {
            if (bVar2 != 8) {
              __assert_fail("Bac_ObjIsBo(p, i) && !Bac_ObjBit(p, i)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/bac/bac.h"
                            ,0x13a,"int Bac_BoxBoRange(Bac_Ntk_t *, int)");
            }
            uVar11 = uVar16;
LAB_0030eaca:
            uVar15 = uVar11 + 1;
            if (uVar15 < (uVar17 & 0xffffffff)) {
              lVar12 = uVar11 + 1;
              if ((pcVar9[lVar12] & 0xfeU) == 8) goto code_r0x0030eae5;
              iVar10 = (int)uVar11;
              pcVar9 = "n";
LAB_0030eb20:
              iVar10 = iVar10 + 1;
            }
            else {
              pcVar9 = "n";
            }
            goto LAB_0030eb23;
          }
          if (bVar2 != 2) {
            __assert_fail("Bac_ObjIsPi(p, i) && !Bac_ObjBit(p, i)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/bac/bac.h"
                          ,0x13b,"int Bac_ObjPiRange(Bac_Ntk_t *, int)");
          }
          uVar11 = uVar16;
          do {
            uVar15 = uVar11 + 1;
            if ((uVar17 & 0xffffffff) <= uVar15) {
              pcVar9 = "i";
              goto LAB_0030eb23;
            }
            lVar12 = uVar11 + 1;
            if ((pcVar9[lVar12] & 0xfeU) != 2) {
              iVar10 = (int)uVar11;
              pcVar9 = "i";
              goto LAB_0030eb20;
            }
            uVar11 = uVar15;
          } while ((pcVar9[lVar12] & 1U) != 0);
          pcVar9 = "i";
          goto LAB_0030eaf5;
        }
        if (iVar14 < 1) {
          __assert_fail("iBit > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/bac/bacNtk.c"
                        ,0x148,"void Bac_ManAssignInternWordNamesNtk(Bac_Ntk_t *, Vec_Int_t *)");
        }
        iVar10 = Bac_ObjName(p,i);
        if (iVar10 == 0) {
          if ((long)uVar16 < (long)(p->vType).nSize) {
            if (((p->vType).pArray[uVar16] & 0xfcU) != 4) {
              uVar5 = iVar14 * 4 + 3;
              iVar14 = iVar14 + 1;
              goto LAB_0030ebcd;
            }
            goto LAB_0030f1ac;
          }
          goto LAB_0030f16e;
        }
        goto LAB_0030f1ac;
      }
    }
  }
LAB_0030ebf8:
  uVar4 = (p->vInfo).nSize;
  uVar16 = (ulong)uVar4;
  if (4 < uVar4 + 2) {
    uVar5 = 0;
    uVar19 = 0;
    if (2 < (int)uVar4) {
      lVar12 = 0;
      lVar18 = 0;
      uVar19 = 0;
      uVar5 = 0;
      do {
        if ((int)uVar16 <= lVar12) goto LAB_0030f14f;
        uVar4 = (p->vInfo).pArray[lVar12];
        if ((int)uVar4 < 0) goto LAB_0030f0d3;
        uVar4 = uVar4 & 3;
        if (uVar4 == 2) {
          if ((p->vOutputs).nSize <= (int)uVar19) goto LAB_0030f14f;
          iVar8 = (p->vOutputs).pArray[uVar19];
          lVar7 = (long)iVar8;
          if ((lVar7 < 0) || ((p->vType).nSize <= iVar8)) goto LAB_0030f16e;
          bVar2 = (p->vType).pArray[lVar7];
          if (0xffffffbb < (bVar2 >> 1) - 0x49) goto LAB_0030f209;
          if ((char)bVar2 < '\0') goto LAB_0030f1ea;
          if ((bVar2 & 1) != 0) {
            __assert_fail("!Bac_ObjBit(p, iObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/bac/bacNtk.c"
                          ,0x168,"void Bac_ManAssignInternWordNamesNtk(Bac_Ntk_t *, Vec_Int_t *)");
          }
          if ((bVar2 & 0x7c) != 4) {
            __assert_fail("Bac_ObjIsCo(p, i)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/bac/bac.h"
                          ,0x11d,"int Bac_ObjFanin(Bac_Ntk_t *, int)");
          }
          if ((p->vFanin).nSize <= iVar8) goto LAB_0030f14f;
          iVar8 = (p->vFanin).pArray[lVar7];
          uVar4 = Bac_ObjName(p,iVar8);
          if (uVar4 == 0) goto LAB_0030f0f2;
          if ((int)uVar4 < 0) goto LAB_0030f0d3;
          if ((uVar4 & 2) != 0) {
            __assert_fail("Bac_ObjNameType(p, iObj) <= BAC_NAME_WORD",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/bac/bacNtk.c"
                          ,0x16a,"void Bac_ManAssignInternWordNamesNtk(Bac_Ntk_t *, Vec_Int_t *)");
          }
          uVar4 = Bac_ObjName(p,iVar8);
          if ((int)uVar4 < 0) goto LAB_0030f130;
          if ((p->vInfo).nSize <= lVar12) goto LAB_0030f111;
          piVar6 = (p->vInfo).pArray;
          piVar6[lVar12] = uVar4 & 0x7ffffffc | 2;
          uVar16 = (ulong)(p->vInfo).nSize;
          if ((long)uVar16 <= lVar12) goto LAB_0030f1cb;
          if (piVar6[lVar12 + 1] < 0) {
            iVar8 = 1;
          }
          else {
            iVar14 = piVar6[lVar12 + 2] - piVar6[lVar12 + 1];
            iVar8 = -iVar14;
            if (0 < iVar14) {
              iVar8 = iVar14;
            }
            iVar8 = iVar8 + 1;
          }
          uVar19 = uVar19 + iVar8;
        }
        else {
          if (uVar4 != 1) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/bac/bacNtk.c"
                          ,0x16e,"void Bac_ManAssignInternWordNamesNtk(Bac_Ntk_t *, Vec_Int_t *)");
          }
          if ((p->vInputs).nSize <= (int)uVar5) goto LAB_0030f14f;
          iVar8 = (p->vInputs).pArray[uVar5];
          if (((long)iVar8 < 0) || ((p->vType).nSize <= iVar8)) goto LAB_0030f16e;
          bVar2 = (p->vType).pArray[iVar8];
          if (0xffffffbb < (bVar2 >> 1) - 0x49) {
LAB_0030f209:
            __assertion = "!Bac_ObjIsBox(p, i)";
            __file = 
            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/bac/bac.h"
            ;
            pcVar9 = "int Bac_ObjBit(Bac_Ntk_t *, int)";
            goto LAB_0030f0e8;
          }
          if ((char)bVar2 < '\0') {
LAB_0030f1ea:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                          ,0x10d,"int Abc_LitIsCompl(int)");
          }
          if ((bVar2 & 1) != 0) {
            __assert_fail("!Bac_ObjBit(p, iObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/bac/bacNtk.c"
                          ,0x160,"void Bac_ManAssignInternWordNamesNtk(Bac_Ntk_t *, Vec_Int_t *)");
          }
          uVar4 = Bac_ObjName(p,iVar8);
          if (uVar4 == 0) goto LAB_0030f0f2;
          if ((int)uVar4 < 0) goto LAB_0030f0d3;
          if ((uVar4 & 2) != 0) {
            __assert_fail("Bac_ObjNameType(p, iObj) <= BAC_NAME_WORD",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/bac/bacNtk.c"
                          ,0x161,"void Bac_ManAssignInternWordNamesNtk(Bac_Ntk_t *, Vec_Int_t *)");
          }
          uVar4 = Bac_ObjName(p,iVar8);
          if ((int)uVar4 < 0) goto LAB_0030f130;
          if ((p->vInfo).nSize <= lVar12) goto LAB_0030f111;
          piVar6 = (p->vInfo).pArray;
          piVar6[lVar12] = (uVar4 & 0x7ffffffc) + 1;
          uVar16 = (ulong)(p->vInfo).nSize;
          if ((long)uVar16 <= lVar12) {
LAB_0030f1cb:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                          ,0x1af,"int *Vec_IntEntryP(Vec_Int_t *, int)");
          }
          if (piVar6[lVar12 + 1] < 0) {
            iVar8 = 1;
          }
          else {
            iVar14 = piVar6[lVar12 + 2] - piVar6[lVar12 + 1];
            iVar8 = -iVar14;
            if (0 < iVar14) {
              iVar8 = iVar14;
            }
            iVar8 = iVar8 + 1;
          }
          uVar5 = uVar5 + iVar8;
        }
        lVar18 = lVar18 + 1;
        lVar12 = lVar12 + 3;
      } while (lVar18 < (int)uVar16 / 3);
    }
    if (uVar5 != (p->vInputs).nSize) {
      __assert_fail("nPis == Bac_NtkPiNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/bac/bacNtk.c"
                    ,0x170,"void Bac_ManAssignInternWordNamesNtk(Bac_Ntk_t *, Vec_Int_t *)");
    }
    if (uVar19 != (p->vOutputs).nSize) {
      __assert_fail("nPos == Bac_NtkPoNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/bac/bacNtk.c"
                    ,0x171,"void Bac_ManAssignInternWordNamesNtk(Bac_Ntk_t *, Vec_Int_t *)");
    }
    uVar17 = (ulong)(uint)(p->vType).nSize;
  }
  uVar5 = (uint)uVar17;
  uVar4 = uVar5;
  if (1 < uVar5) {
    uVar4 = 0;
    uVar19 = uVar5 - 1;
    do {
      uVar4 = uVar4 + 1;
      bVar3 = 9 < uVar19;
      uVar19 = uVar19 / 10;
    } while (bVar3);
  }
  if (0 < (int)uVar5) {
    lVar12 = 0;
    do {
      bVar2 = (p->vType).pArray[lVar12];
      if (0xffffffbb < (bVar2 >> 1) - 0x49) {
        if ((bVar2 & 0xfc) == 4) {
LAB_0030f18d:
          __assert_fail("!Bac_ObjIsCo(p, i)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/bac/bac.h"
                        ,0x11f,"int Bac_ObjNameInt(Bac_Ntk_t *, int)");
        }
        if ((p->vName).nSize <= lVar12) {
LAB_0030f14f:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        if ((p->vName).pArray[lVar12] == 0) {
          iVar10 = (int)lVar12;
          iVar8 = Bac_ManAssignInternTwo(p,iVar10,uVar4,"g",vMap);
          iVar14 = Bac_ObjName(p,iVar10);
          if (iVar14 != 0) {
LAB_0030f1ac:
            __assert_fail("Bac_ObjName(p, i) == 0 && !Bac_ObjIsCo(p, i)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/bac/bac.h"
                          ,300,"void Bac_ObjSetName(Bac_Ntk_t *, int, int)");
          }
          if ((p->vType).nSize <= lVar12) {
LAB_0030f16e:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecStr.h"
                          ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
          }
          if (((p->vType).pArray[lVar12] & 0xfcU) == 4) goto LAB_0030f1ac;
          Vec_IntSetEntry(&p->vName,iVar10,iVar8 << 2);
          uVar17 = (ulong)(uint)(p->vType).nSize;
        }
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < (int)uVar17);
  }
  if (0 < (p->vInputs).nSize) {
    lVar12 = 0;
    do {
      iVar8 = (p->vInputs).pArray[lVar12];
      uVar4 = Bac_ObjName(p,iVar8);
      if (uVar4 == 0) {
LAB_0030f0f2:
        __assert_fail("n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/bac/bac.h"
                      ,0x107,"Bac_NameType_t Bac_NameType(int)");
      }
      if ((int)uVar4 < 0) {
LAB_0030f0d3:
        __assertion = "Lit >= 0";
        __file = 
        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
        ;
        pcVar9 = "int Abc_Lit2Att2(int)";
LAB_0030f0e8:
        __assert_fail(__assertion,__file,0x11b,pcVar9);
      }
      if ((uVar4 & 2) == 0) {
        uVar4 = Bac_ObjName(p,iVar8);
        if ((int)uVar4 < 0) goto LAB_0030f130;
        if (vMap->nSize <= (int)(uVar4 >> 2)) goto LAB_0030f111;
        vMap->pArray[uVar4 >> 2] = 0;
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < (p->vInputs).nSize);
    uVar17 = (ulong)(uint)(p->vType).nSize;
  }
  if (0 < (int)uVar17) {
    lVar12 = 1;
    lVar18 = 2;
    lVar7 = 0;
    do {
      if (0xffffffbb < ((byte)(p->vType).pArray[lVar7] >> 1) - 0x49) {
        uVar4 = Bac_ObjName(p,(int)lVar7);
        if ((int)uVar4 < 0) {
LAB_0030f130:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                        ,0x11a,"int Abc_Lit2Var2(int)");
        }
        if (vMap->nSize <= (int)(uVar4 >> 2)) {
LAB_0030f111:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        vMap->pArray[uVar4 >> 2] = 0;
        uVar17 = (ulong)(p->vType).nSize;
        if (lVar7 + 1 < (long)uVar17) {
          bVar2 = (p->vType).pArray[lVar12];
          lVar13 = lVar18;
          while ((bVar2 & 0xfe) == 8) {
            iVar8 = (int)lVar13 + -1;
            uVar4 = Bac_ObjName(p,iVar8);
            if (uVar4 == 0) goto LAB_0030f0f2;
            if ((int)uVar4 < 0) goto LAB_0030f0d3;
            if ((uVar4 & 2) == 0) {
              uVar4 = Bac_ObjName(p,iVar8);
              if ((int)uVar4 < 0) goto LAB_0030f130;
              if (vMap->nSize <= (int)(uVar4 >> 2)) goto LAB_0030f111;
              vMap->pArray[uVar4 >> 2] = 0;
            }
            uVar4 = (p->vType).nSize;
            uVar17 = (ulong)uVar4;
            if ((int)uVar4 <= (int)lVar13) break;
            pbVar1 = (byte *)((p->vType).pArray + lVar13);
            lVar13 = lVar13 + 1;
            bVar2 = *pbVar1;
          }
        }
      }
      lVar7 = lVar7 + 1;
      lVar12 = lVar12 + 1;
      lVar18 = lVar18 + 1;
    } while (lVar7 < (int)uVar17);
  }
  return;
code_r0x0030eae5:
  uVar11 = uVar15;
  if ((pcVar9[lVar12] & 1U) == 0) goto code_r0x0030eaee;
  goto LAB_0030eaca;
code_r0x0030eaee:
  pcVar9 = "n";
LAB_0030eaf5:
  iVar10 = (int)uVar15;
LAB_0030eb23:
  iVar14 = Bac_ManAssignInternTwo(p,iVar8,uVar4,pcVar9,vMap);
  uVar5 = iVar14 << 2;
  if (iVar10 - i == 1) {
    iVar14 = Bac_ObjName(p,i);
    if (iVar14 != 0) goto LAB_0030f1ac;
    if ((long)(p->vType).nSize <= (long)uVar16) goto LAB_0030f16e;
    iVar14 = 1;
    iVar8 = iVar8 + 1;
    if (((p->vType).pArray[uVar16] & 0xfcU) == 4) goto LAB_0030f1ac;
  }
  else {
    iVar14 = Bac_ObjName(p,i);
    if (iVar14 != 0) goto LAB_0030f1ac;
    if ((long)(p->vType).nSize <= (long)uVar16) goto LAB_0030f16e;
    if (((p->vType).pArray[uVar16] & 0xfcU) == 4) goto LAB_0030f1ac;
    uVar5 = uVar5 | 1;
    iVar14 = 1;
    iVar8 = iVar8 + 1;
  }
LAB_0030ebcd:
  Vec_IntSetEntry(&p->vName,i,uVar5);
LAB_0030ebe8:
  uVar16 = uVar16 + 1;
  uVar17 = (ulong)(p->vType).nSize;
  if ((long)uVar17 <= (long)uVar16) goto LAB_0030ebf8;
  goto LAB_0030e9cc;
}

Assistant:

void Bac_ManAssignInternWordNamesNtk( Bac_Ntk_t * p, Vec_Int_t * vMap )
{
    int k, iObj, iTerm, iName = -1, iBit = -1;
    int nDigits, nPis = 0, nPos = 0, nNames = 1;
    // start names
    if ( !Bac_NtkHasNames(p) )
        Bac_NtkStartNames(p);
    nDigits = Abc_Base10Log( Bac_ManAssignCountNames(p) );
    // populate map with the currently used names
    Bac_NtkForEachCi( p, iObj )
        if ( Bac_ObjNameInt(p, iObj) )
            Vec_IntWriteEntry( vMap, Bac_ObjNameId(p, iObj), 1 );
    Bac_NtkForEachBox( p, iObj )
        if ( Bac_ObjNameInt(p, iObj) )
            Vec_IntWriteEntry( vMap, Bac_ObjNameId(p, iObj), 1 );
    // assign CI names
    Bac_NtkForEachCi( p, iObj )
    {
        if ( Bac_ObjNameInt(p, iObj) )
        {
            iName = -1;
            iBit = -1;
            continue;
        }
        if ( Bac_ObjBit(p, iObj) )
        {
            assert( iBit > 0 );
            Bac_ObjSetName( p, iObj, Abc_Var2Lit2(iBit++, BAC_NAME_INDEX) );
        }
        else
        {
            //int Type = Bac_ObjType(p, iObj);
            int Range = Bac_ObjIsPi(p, iObj) ? Bac_ObjPiRange(p, iObj) : Bac_BoxBoRange(p, iObj);
            iName = Bac_ManAssignInternTwo( p, nNames++, nDigits, (char*)(Bac_ObjIsPi(p, iObj) ? "i":"n"), vMap );
            if ( Range == 1 )
                Bac_ObjSetName( p, iObj, Abc_Var2Lit2(iName, BAC_NAME_BIN) );
            else
                Bac_ObjSetName( p, iObj, Abc_Var2Lit2(iName, BAC_NAME_WORD) );
            iBit = 1;
        }
    }
    // transfer names to the interface
    if ( Bac_NtkInfoNum(p) )
    {
        for ( k = 0; k < Bac_NtkInfoNum(p); k++ )
        {
            //char * pName = Bac_NtkName(p);
            if ( Bac_NtkInfoType(p, k) == 1 ) // PI
            {
                iObj = Bac_NtkPi(p, nPis);
                assert( !Bac_ObjBit(p, iObj) );
                assert( Bac_ObjNameType(p, iObj) <= BAC_NAME_WORD );
                Bac_NtkSetInfoName( p, k, Abc_Var2Lit2(Bac_ObjNameId(p, iObj), 1) );
                nPis += Bac_NtkInfoRange(p, k);
            }
            else if ( Bac_NtkInfoType(p, k) == 2 ) // PO
            {
                iObj = Bac_NtkPo(p, nPos);
                assert( !Bac_ObjBit(p, iObj) );
                iObj = Bac_ObjFanin(p, iObj);
                assert( Bac_ObjNameType(p, iObj) <= BAC_NAME_WORD );
                Bac_NtkSetInfoName( p, k, Abc_Var2Lit2(Bac_ObjNameId(p, iObj), 2) );
                nPos += Bac_NtkInfoRange(p, k);
            }
            else assert( 0 );
        }
        assert( nPis == Bac_NtkPiNum(p) );
        assert( nPos == Bac_NtkPoNum(p) );
    }
    // assign instance names
    nDigits = Abc_Base10Log( Bac_NtkObjNum(p) );
    Bac_NtkForEachBox( p, iObj )
        if ( !Bac_ObjNameInt(p, iObj) )
        {
            iName = Bac_ManAssignInternTwo( p, iObj, nDigits, "g", vMap );
            Bac_ObjSetName( p, iObj, Abc_Var2Lit2(iName, BAC_NAME_BIN) );
        }
    // unmark all names
    Bac_NtkForEachPi( p, iObj, k )
        if ( Bac_ObjNameType(p, iObj) <= BAC_NAME_WORD )
            Vec_IntWriteEntry( vMap, Bac_ObjNameId(p, iObj), 0 );
    Bac_NtkForEachBox( p, iObj )
    {
        Vec_IntWriteEntry( vMap, Bac_ObjNameId(p, iObj), 0 );
        Bac_BoxForEachBo( p, iObj, iTerm, k )
            if ( Bac_ObjNameType(p, iTerm) <= BAC_NAME_WORD )
                Vec_IntWriteEntry( vMap, Bac_ObjNameId(p, iTerm), 0 );
    }
//    printf( "Generated %d word-level names.\n", nNames-1 );
}